

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

size_t write_str_tag(MIR_context_t ctx,writer_func_t writer,MIR_str_t str,bin_tag_t start_tag)

{
  uint uVar1;
  io_ctx *piVar2;
  reduce_data *data;
  bool bVar3;
  string_t el;
  int iVar4;
  size_t sVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint8_t uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  string_t string;
  string_t local_58;
  string_t local_40;
  
  local_58.str.s = str.s;
  local_58.str.len = str.len;
  piVar2 = ctx->io_ctx;
  if (writer == (writer_func_t)0x0) {
    string_store(&local_58,ctx,&piVar2->output_strings,&piVar2->output_string_tab,str);
    sVar5 = 0;
  }
  else {
    el.str.len = local_58.str.len;
    el.num = local_58.num;
    el.str.s = local_58.str.s;
    iVar4 = HTAB_string_t_do(piVar2->output_string_tab,el,HTAB_FIND,&local_40);
    if ((iVar4 == 0) || (local_40.num == 0)) {
      __assert_fail("ok_p && string.num >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12ba,
                    "size_t write_str_tag(MIR_context_t, writer_func_t, MIR_str_t, bin_tag_t)");
    }
    if (local_40.num < 0x81) {
      lVar11 = 0;
    }
    else {
      uVar7 = local_40.num - 1;
      uVar10 = 0xffffffffffffffff;
      do {
        uVar9 = uVar10;
        uVar10 = uVar9 + 1;
        bVar3 = 0xff < uVar7;
        uVar7 = uVar7 >> 8;
      } while (bVar3);
      if (3 < uVar10) {
        __assert_fail("nb <= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x12bc,
                      "size_t write_str_tag(MIR_context_t, writer_func_t, MIR_str_t, bin_tag_t)");
      }
      lVar11 = uVar9 + 2;
    }
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    uVar8 = (char)start_tag + -1 + (char)lVar11;
    data = ctx->io_ctx->io_reduce_data;
    uVar1 = data->buf_bound;
    if ((ulong)uVar1 < 0x40000) {
      uVar6 = uVar1 + 1;
      data->buf[uVar1] = uVar8;
    }
    else {
      _reduce_encode_buf(data);
      uVar6 = 1;
      data->buf[0] = uVar8;
    }
    data->buf_bound = uVar6;
    sVar5 = put_uint(ctx,writer,local_40.num - 1,(int)lVar11);
    sVar5 = sVar5 + 1;
  }
  return sVar5;
}

Assistant:

static size_t write_str_tag (MIR_context_t ctx, writer_func_t writer, MIR_str_t str,
                             bin_tag_t start_tag) {
  size_t nb;
  int ok_p;
  string_t string;

  if (writer == NULL) {
    string_store (ctx, &output_strings, &output_string_tab, str);
    return 0;
  }
  ok_p = string_find (&output_strings, &output_string_tab, str, &string);
  mir_assert (ok_p && string.num >= 1);
  nb = uint_length (string.num - 1);
  mir_assert (nb <= 4);
  if (nb == 0) nb = 1;
  put_byte (ctx, writer, start_tag + (int) nb - 1);
  return put_uint (ctx, writer, string.num - 1, (int) nb) + 1;
}